

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void AdjustMeshPeriodicTextureCoordinatesHelper
               (ON_Mesh *mesh,ON_Xform *mesh_xform,float *mesh_T,int mesh_T_stride,int *Tsd,
               double two_pi_tc,ON_TextureMapping *mapping)

{
  uint uVar1;
  TYPE TVar2;
  int iVar3;
  double dVar4;
  uint uVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  int *piVar9;
  void *pvVar10;
  int iVar11;
  uint uVar12;
  size_t size;
  long lVar13;
  long lVar14;
  uint uVar15;
  size_t sVar16;
  int iVar17;
  ON_Xform *pOVar18;
  uint uVar19;
  ON__CChangeTextureCoordinateHelper *pOVar20;
  ON__CMeshFaceTC *pOVar21;
  ulong uVar22;
  ON_3fVector *pOVar23;
  int *piVar24;
  ON_MeshFace *pOVar25;
  uint uVar26;
  int iVar28;
  ON_MeshFace *pOVar29;
  ON_2fPoint *tc;
  ON_3fPoint *pOVar30;
  float *pfVar31;
  byte bVar32;
  ulong uVar33;
  bool bVar34;
  ulong uVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined4 uVar39;
  float fVar40;
  undefined4 uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  double dVar45;
  double dVar46;
  float fVar47;
  float fVar48;
  double dVar49;
  ON_3dPoint local_2d8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float *mesh_T_local;
  int local_29c;
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list;
  ON_2fPoint OStack_27c;
  ON_2fPoint aOStack_274 [2];
  int *local_260;
  ON_Workspace ws;
  double local_248;
  float *local_230;
  ON__CMeshFaceTC ftc;
  int sd [4];
  ON_MeshFace *local_170;
  undefined1 local_168 [16];
  double local_158;
  undefined1 local_148 [16];
  double local_138;
  ON_Workspace_FBLK *local_130;
  ON_Xform *local_128;
  ON_Xform *local_120;
  ON_Xform *local_118;
  ON_SimpleArray<ON__CNewMeshFace> mflist;
  ON_3dVector n;
  ON_3dVector local_e0;
  ON_3dPoint local_c8;
  ON__CChangeTextureCoordinateHelper helper;
  ulong uVar27;
  
  bVar32 = 0;
  iVar11 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  size = (size_t)iVar11;
  if (((2 < (long)size) && (uVar1 = (mesh->m_F).m_count, 0 < (int)uVar1)) &&
     (iVar11 == (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count)) {
    TVar2 = mapping->m_type;
    bVar34 = Tsd != (int *)0x0;
    lVar6 = (long)mesh_T_stride;
    mesh_T_local = mesh_T;
    local_260 = Tsd;
    if ((TVar2 != box_mapping || !bVar34) || (mapping->m_texture_space != single)) {
      local_2b8 = (double)CONCAT71(local_2b8._1_7_,TVar2 == cylinder_mapping);
      ON_Workspace::ON_Workspace(&ws);
      piVar9 = ON_Workspace::GetIntMemory(&ws,size);
      pvVar10 = ON_Workspace::GetMemory(&ws,size * 4);
      bVar32 = bVar34 & (byte)local_2b8;
      local_2b8 = (double)CONCAT44(local_2b8._4_4_,(float)(two_pi_tc * 0.25));
      fVar36 = (float)(two_pi_tc * 0.75);
      pfVar31 = mesh_T + 1;
      iVar11 = 0;
      uVar26 = 0;
      for (sVar16 = 0; size != sVar16; sVar16 = sVar16 + 1) {
        piVar9[sVar16] = 0;
        fVar37 = pfVar31[-1];
        *(float *)((long)pvVar10 + sVar16 * 4) = fVar37;
        if (bVar32 == 0) {
          if (TVar2 != box_mapping || !bVar34) {
            if (TVar2 != sphere_mapping) goto LAB_004f819f;
            uVar15 = 8;
            if ((0.001 <= *pfVar31) && (*pfVar31 <= 0.999)) goto LAB_004f819f;
          }
          else {
            if ((local_260[sVar16] | 2U) != 3) goto LAB_004f81be;
LAB_004f819f:
            uVar15 = 1;
            if (((float)(two_pi_tc * 0.25) <= fVar37) && (uVar15 = 4, fVar37 <= fVar36))
            goto LAB_004f81be;
          }
          piVar9[sVar16] = uVar15;
          uVar26 = uVar26 | uVar15;
          iVar11 = iVar11 + 1;
        }
        else if (local_260[sVar16] == 1) goto LAB_004f819f;
LAB_004f81be:
        pfVar31 = pfVar31 + lVar6;
      }
      if ((4 < uVar26) || ((0x13U >> uVar26 & 1) == 0)) {
        ON_SimpleArray<ON__CMeshFaceTC>::ON_SimpleArray(&ftc_list,(long)(iVar11 * 4 + 0x80));
        pOVar25 = (mesh->m_F).m_a;
        ftc.quad[3] = 0;
        ftc.Tx[0] = 0.0;
        ftc.Tx[1] = 0.0;
        ftc.Tx[2] = 0.0;
        ftc.fi = 0;
        ftc.quad[0] = 0;
        ftc.quad[1] = 0;
        ftc.quad[2] = 0;
        ftc.Tx[3] = 0.0;
        ftc.bSetT[0] = false;
        ftc.bSetT[1] = false;
        ftc.bSetT[2] = false;
        ftc.bSetT[3] = false;
        fVar37 = (float)two_pi_tc;
        piVar24 = pOVar25->vi + 3;
        for (uVar22 = 0; uVar1 != uVar22; uVar22 = uVar22 + 1) {
          uVar26 = piVar9[((ON_MeshFace *)(piVar24 + -3))->vi[0]];
          ftc.quad[0] = uVar26;
          uVar15 = piVar9[piVar24[-2]];
          uVar12 = piVar9[piVar24[-1]];
          ftc.quad[2] = uVar12;
          ftc.quad[1] = uVar15;
          uVar5 = piVar9[*piVar24];
          ftc.quad[3] = uVar5;
          uVar19 = uVar12 | uVar5 | uVar15 | uVar26;
          if ((4 < uVar19) || ((0x13U >> (uVar19 & 0x1f) & 1) == 0)) {
            ftc.fi = -1;
            fVar38 = *(float *)((long)pvVar10 + (long)((ON_MeshFace *)(piVar24 + -3))->vi[0] * 4);
            ftc.Tx[0] = fVar38;
            fVar40 = *(float *)((long)pvVar10 + (long)piVar24[-2] * 4);
            fVar44 = *(float *)((long)pvVar10 + (long)piVar24[-1] * 4);
            ftc.Tx[2] = fVar44;
            ftc.Tx[1] = fVar40;
            fVar48 = *(float *)((long)pvVar10 + (long)*piVar24 * 4);
            ftc.Tx[3] = fVar48;
            iVar11 = (int)uVar22;
            if ((uVar19 & 8) == 0) {
              iVar17 = -1;
            }
            else {
              if (uVar26 == 8) {
                fVar42 = -1.234321e+38;
                if (uVar5 != 8) {
                  fVar42 = fVar48;
                }
                fVar47 = -1.234321e+38;
                if (uVar15 != 8) {
                  fVar47 = fVar40;
                }
                if ((fVar42 == -1.234321e+38) && (!NAN(fVar42))) {
                  uVar26 = 8;
                  if ((fVar47 == -1.234321e+38) && (iVar17 = -1, !NAN(fVar47))) goto LAB_004f83ab;
                }
                if (((fVar42 != -1.234321e+38) || (fVar38 = fVar47, NAN(fVar42))) &&
                   ((fVar47 != -1.234321e+38 || (fVar38 = fVar42, NAN(fVar47))))) {
                  fVar38 = (fVar47 + fVar42) * 0.5;
                }
                ftc.Tx[0] = fVar38;
                uVar26 = (uint)(fVar36 < fVar38) << 2;
                if (fVar38 < (float)local_2b8) {
                  uVar26 = 1;
                }
                uVar19 = uVar19 | uVar26;
                ftc.quad[0] = uVar26;
                ftc.fi = iVar11;
                iVar17 = iVar11;
              }
              else {
                iVar17 = -1;
              }
LAB_004f83ab:
              if (uVar15 == 8) {
                fVar42 = -1.234321e+38;
                if (uVar26 != 8) {
                  fVar42 = fVar38;
                }
                fVar47 = -1.234321e+38;
                if (uVar12 != 8) {
                  fVar47 = fVar44;
                }
                if ((((fVar42 != -1.234321e+38) || (NAN(fVar42))) || (fVar47 != -1.234321e+38)) ||
                   (NAN(fVar47))) {
                  if (((fVar42 != -1.234321e+38) || (fVar40 = fVar47, NAN(fVar42))) &&
                     ((fVar47 != -1.234321e+38 || (fVar40 = fVar42, NAN(fVar47))))) {
                    fVar40 = (fVar47 + fVar42) * 0.5;
                  }
                  ftc.Tx[1] = fVar40;
                  uVar15 = (uint)(fVar36 < fVar40) << 2;
                  if (fVar40 < (float)local_2b8) {
                    uVar15 = 1;
                  }
                  ftc.quad[1] = uVar15;
                  uVar19 = uVar19 | uVar15;
                  ftc.fi = iVar11;
                  iVar17 = iVar11;
                }
                else {
                  uVar15 = 8;
                }
              }
              if (uVar12 == 8) {
                fVar42 = -1.234321e+38;
                if (uVar15 != 8) {
                  fVar42 = fVar40;
                }
                fVar47 = fVar38;
                uVar12 = uVar26;
                if (piVar24[-1] != *piVar24) {
                  fVar47 = fVar48;
                  uVar12 = uVar5;
                }
                fVar43 = -1.234321e+38;
                if (uVar12 != 8) {
                  fVar43 = fVar47;
                }
                if (((fVar42 != -1.234321e+38) || (NAN(fVar42))) ||
                   ((fVar43 != -1.234321e+38 || (NAN(fVar43))))) {
                  if (((fVar42 != -1.234321e+38) || (fVar44 = fVar43, NAN(fVar42))) &&
                     ((fVar43 != -1.234321e+38 || (fVar44 = fVar42, NAN(fVar43))))) {
                    fVar44 = (fVar42 + fVar43) * 0.5;
                  }
                  uVar12 = (uint)(fVar36 < fVar44) << 2;
                  if (fVar44 < (float)local_2b8) {
                    uVar12 = 1;
                  }
                  ftc.Tx[2] = fVar44;
                  ftc.quad[2] = uVar12;
                  if (piVar24[-1] == *piVar24) {
                    ftc.Tx[3] = fVar44;
                    ftc.quad[3] = uVar12;
                    fVar48 = fVar44;
                    uVar5 = uVar12;
                  }
                  uVar19 = uVar19 | uVar12;
                  ftc.fi = iVar11;
                  iVar17 = iVar11;
                }
                else {
                  uVar12 = 8;
                }
              }
              if (uVar5 == 8) {
                if (piVar24[-1] != *piVar24) {
                  fVar42 = -1.234321e+38;
                  if (uVar12 != 8) {
                    fVar42 = fVar44;
                  }
                  fVar47 = -1.234321e+38;
                  if (uVar26 != 8) {
                    fVar47 = fVar38;
                  }
                  if ((((fVar42 != -1.234321e+38) || (NAN(fVar42))) || (fVar47 != -1.234321e+38)) ||
                     (NAN(fVar47))) {
                    if (((fVar42 != -1.234321e+38) || (fVar48 = fVar47, NAN(fVar42))) &&
                       ((fVar47 != -1.234321e+38 || (fVar48 = fVar42, NAN(fVar47))))) {
                      fVar48 = (fVar42 + fVar47) * 0.5;
                    }
                    ftc.Tx[3] = fVar48;
                    uVar5 = (uint)(fVar36 < fVar48) << 2;
                    if (fVar48 < (float)local_2b8) {
                      uVar5 = 1;
                    }
                    ftc.quad[3] = uVar5;
                    uVar19 = uVar19 | uVar5;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                    goto LAB_004f85d8;
                  }
                }
                uVar5 = 8;
              }
            }
LAB_004f85d8:
            if ((~uVar19 & 5) == 0) {
              if ((two_pi_tc != 1.0) || (NAN(two_pi_tc))) {
                if (uVar26 == 4) {
                  fVar42 = 0.0;
                  fVar47 = (fVar37 - fVar38) + 0.0;
                }
                else {
                  fVar42 = 0.0;
                  fVar47 = 0.0;
                  if (uVar26 == 1) {
                    fVar42 = fVar38 + 0.0;
                  }
                }
                if (uVar15 == 4) {
                  fVar47 = fVar47 + (fVar37 - fVar40);
                }
                else if (uVar15 == 1) {
                  fVar42 = fVar42 + fVar40;
                }
                if (uVar12 == 4) {
                  fVar47 = fVar47 + (fVar37 - fVar44);
                }
                else if (uVar12 == 1) {
                  fVar42 = fVar42 + fVar44;
                }
                if (piVar24[-1] != *piVar24) {
                  if (uVar5 == 4) {
                    fVar47 = fVar47 + (fVar37 - fVar48);
                  }
                  else if (uVar5 == 1) {
                    fVar42 = fVar42 + fVar48;
                  }
                }
                if (fVar47 <= fVar42) {
                  if (uVar26 == 4) {
                    ftc._16_8_ = ftc._16_8_ & 0xffffffff;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                  }
                  if (uVar15 == 4) {
                    ftc.Tx._4_8_ = (ulong)(uint)ftc.Tx[2] << 0x20;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                  }
                  if (uVar12 == 4) {
                    ftc.Tx._4_8_ = ftc.Tx._4_8_ & 0xffffffff;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                  }
                  if (uVar5 == 4) {
                    ftc.Tx[3] = 0.0;
                    fVar38 = ftc.Tx[3];
                    goto LAB_004f8779;
                  }
                }
                else {
                  if (uVar26 == 1) {
                    ftc.Tx[0] = fVar37;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                  }
                  if (uVar15 == 1) {
                    ftc.Tx[1] = fVar37;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                  }
                  if (uVar12 == 1) {
                    ftc.Tx[2] = fVar37;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                  }
                  fVar38 = fVar37;
                  if (uVar5 == 1) {
LAB_004f8779:
                    ftc.Tx[3] = fVar38;
                    ftc.fi = iVar11;
                    iVar17 = iVar11;
                  }
                }
              }
              else {
                if (uVar26 == 1) {
                  ftc.Tx[0] = fVar38 + 1.0;
                  ftc.fi = iVar11;
                  iVar17 = iVar11;
                }
                if (uVar15 == 1) {
                  ftc.Tx[1] = fVar40 + 1.0;
                  ftc.fi = iVar11;
                  iVar17 = iVar11;
                }
                if (uVar12 == 1) {
                  ftc.Tx[2] = fVar44 + 1.0;
                  ftc.fi = iVar11;
                  iVar17 = iVar11;
                }
                if (uVar5 == 1) {
                  fVar38 = fVar48 + 1.0;
                  goto LAB_004f8779;
                }
              }
            }
            if (-1 < iVar17) {
              ON_SimpleArray<ON__CMeshFaceTC>::Append(&ftc_list,&ftc);
            }
          }
          piVar24 = piVar24 + 4;
        }
        if (0 < (long)ftc_list.m_count) {
          lVar14 = (long)ftc_list.m_count * 0x28;
          iVar11 = 0;
          for (lVar6 = 0; lVar14 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
            iVar17 = *(int *)((long)(ftc_list.m_a)->quad + lVar6 + -4);
            fVar36 = *(float *)((long)(ftc_list.m_a)->Tx + lVar6);
            pfVar31 = (float *)((long)pvVar10 + (long)pOVar25[iVar17].vi[0] * 4);
            if ((fVar36 != *pfVar31) || (NAN(fVar36) || NAN(*pfVar31))) {
              (ftc_list.m_a)->bSetT[lVar6] = true;
              iVar11 = iVar11 + 1;
            }
            fVar36 = *(float *)((long)(ftc_list.m_a)->Tx + lVar6 + 4);
            pfVar31 = (float *)((long)pvVar10 + (long)pOVar25[iVar17].vi[1] * 4);
            if ((fVar36 != *pfVar31) || (NAN(fVar36) || NAN(*pfVar31))) {
              (ftc_list.m_a)->bSetT[lVar6 + 1] = true;
              iVar11 = iVar11 + 1;
            }
            fVar36 = *(float *)((long)(ftc_list.m_a)->Tx + lVar6 + 8);
            iVar28 = pOVar25[iVar17].vi[2];
            pfVar31 = (float *)((long)pvVar10 + (long)iVar28 * 4);
            if ((fVar36 != *pfVar31) || (NAN(fVar36) || NAN(*pfVar31))) {
              (ftc_list.m_a)->bSetT[lVar6 + 2] = true;
              iVar11 = iVar11 + 1;
            }
            if (iVar28 != pOVar25[iVar17].vi[3]) {
              fVar36 = *(float *)((long)(ftc_list.m_a)->Tx + lVar6 + 0xc);
              pfVar31 = (float *)((long)pvVar10 + (long)pOVar25[iVar17].vi[3] * 4);
              if ((fVar36 != *pfVar31) || (NAN(fVar36) || NAN(*pfVar31))) {
                (ftc_list.m_a)->bSetT[lVar6 + 3] = true;
                iVar11 = iVar11 + 1;
              }
            }
          }
          if (0 < iVar11) {
            ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
                      (&helper,mesh,iVar11,&mesh_T_local);
            for (lVar6 = 0; pOVar21 = ftc_list.m_a, lVar14 - lVar6 != 0; lVar6 = lVar6 + 0x28) {
              pOVar25 = (mesh->m_F).m_a + *(int *)((long)(ftc_list.m_a)->quad + lVar6 + -4);
              if ((ftc_list.m_a)->bSetT[lVar6] == true) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          (&helper,pOVar25->vi,0,*(float *)((long)(ftc_list.m_a)->Tx + lVar6),
                           -1.234321e+38,mesh_T_local,mesh_T_stride);
              }
              if (pOVar21->bSetT[lVar6 + 1] == true) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          (&helper,pOVar25->vi,1,*(float *)((long)pOVar21->Tx + lVar6 + 4),
                           -1.234321e+38,mesh_T_local,mesh_T_stride);
              }
              if (pOVar21->bSetT[lVar6 + 2] == true) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          (&helper,pOVar25->vi,2,*(float *)((long)pOVar21->Tx + lVar6 + 8),
                           -1.234321e+38,mesh_T_local,mesh_T_stride);
              }
              if (pOVar21->bSetT[lVar6 + 3] == true) {
                ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                          (&helper,pOVar25->vi,3,*(float *)((long)pOVar21->Tx + lVar6 + 0xc),
                           -1.234321e+38,mesh_T_local,mesh_T_stride);
              }
            }
            ON__CChangeTextureCoordinateHelper::~ON__CChangeTextureCoordinateHelper(&helper);
          }
        }
        ON_SimpleArray<ON__CMeshFaceTC>::~ON_SimpleArray(&ftc_list);
      }
      ON_Workspace::~ON_Workspace(&ws);
    }
    else {
      pOVar25 = (mesh->m_F).m_a;
      local_230 = mesh_T;
      ON_SimpleArray<ON__CNewMeshFace>::ON_SimpleArray(&mflist,0x200);
      local_118 = &mapping->m_Pxyz;
      local_120 = &mapping->m_Nxyz;
      local_128 = &mapping->m_uvw;
      local_29c = 0;
      local_170 = pOVar25;
      for (uVar22 = 0; pfVar31 = local_230, uVar22 != uVar1; uVar22 = uVar22 + 1) {
        iVar17 = local_260[pOVar25[uVar22].vi[0]];
        sd[1] = local_260[pOVar25[uVar22].vi[1]];
        iVar28 = pOVar25[uVar22].vi[2];
        sd[2] = local_260[iVar28];
        iVar3 = pOVar25[uVar22].vi[3];
        sd[3] = local_260[iVar3];
        sd[0] = iVar17;
        if (((iVar17 != sd[1]) || (iVar17 != sd[2])) || (iVar17 != sd[3])) {
          pOVar29 = pOVar25 + uVar22;
          OStack_27c.y = 0.0;
          aOStack_274[0].x = 0.0;
          aOStack_274[0].y = 0.0;
          ftc_list.m_count = 0;
          ftc_list.m_capacity = 0;
          OStack_27c.x = 0.0;
          ftc_list._vptr_ON_SimpleArray = (_func_int **)0x0;
          ftc_list.m_a = (ON__CMeshFaceTC *)0x0;
          ON_2fPoint::operator=
                    ((ON_2fPoint *)((long)&ftc_list.m_a + 4),local_230 + pOVar29->vi[0] * lVar6);
          ON_2fPoint::operator=((ON_2fPoint *)&ftc_list.m_capacity,pfVar31 + pOVar29->vi[1] * lVar6)
          ;
          ON_2fPoint::operator=(&OStack_27c,pfVar31 + pOVar29->vi[2] * lVar6);
          ON_2fPoint::operator=(aOStack_274,pfVar31 + pOVar29->vi[3] * lVar6);
          uVar26 = (iVar28 != iVar3) + 3;
          uVar27 = (ulong)uVar26;
          fVar36 = TcDistanceHelper((ON_2fPoint *)((long)&ftc_list.m_a + 4));
          local_2b8 = (double)CONCAT44(local_2b8._4_4_,fVar36);
          tc = (ON_2fPoint *)&ftc_list.m_capacity;
          for (uVar33 = 1; uVar33 < uVar27; uVar33 = uVar33 + 1) {
            fVar36 = TcDistanceHelper(tc);
            if ((float)local_2b8 < fVar36) {
              iVar17 = sd[uVar33];
              local_2b8 = (double)CONCAT44(local_2b8._4_4_,fVar36);
            }
            tc = tc + 1;
          }
          for (uVar33 = 0; uVar35 = uVar27, uVar27 != uVar33; uVar33 = uVar33 + 1) {
            if (sd[uVar33] == iVar17) goto LAB_004f8027;
            iVar28 = local_170->vi[uVar33];
            ON_3dVector::ON_3dVector((ON_3dVector *)local_148,0.0,0.0,0.0);
            pOVar30 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
            bVar34 = ON_Mesh::HasVertexNormals(mesh);
            pOVar23 = (ON_3fVector *)0x0;
            if (bVar34) {
              pOVar23 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
            }
            lVar14 = 0x10;
            pOVar18 = &ON_Xform::IdentityTransformation;
            pOVar20 = &helper;
            for (lVar13 = lVar14; lVar13 != 0; lVar13 = lVar13 + -1) {
              *(double *)pOVar20 = pOVar18->m_xform[0][0];
              pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar32 * -2 + 1) * 8);
              pOVar20 = (ON__CChangeTextureCoordinateHelper *)
                        ((long)pOVar20 + (ulong)bVar32 * -0x10 + 8);
            }
            pOVar18 = &ON_Xform::IdentityTransformation;
            pOVar21 = &ftc;
            for (; lVar14 != 0; lVar14 = lVar14 + -1) {
              *(double *)pOVar21 = pOVar18->m_xform[0][0];
              pOVar18 = (ON_Xform *)((long)pOVar18 + ((ulong)bVar32 * -2 + 1) * 8);
              pOVar21 = (ON__CMeshFaceTC *)((long)pOVar21 + (ulong)bVar32 * -0x10 + 8);
            }
            if (((mesh_xform == (ON_Xform *)0x0) || (bVar34 = ON_Xform::IsZero(mesh_xform), bVar34))
               || (bVar34 = ON_Xform::IsIdentity(mesh_xform,0.0), bVar34)) {
LAB_004f78ce:
              pdVar7 = (double *)0x0;
              bVar34 = false;
            }
            else {
              dVar49 = ON_Xform::GetMappingXforms(mesh_xform,(ON_Xform *)&helper,(ON_Xform *)&ftc);
              if ((dVar49 == 0.0) && (!NAN(dVar49))) goto LAB_004f78ce;
              pdVar7 = ON_Xform::operator[]((ON_Xform *)&helper,0);
              pdVar8 = ON_Xform::operator[]((ON_Xform *)&ftc,0);
              bVar34 = pdVar8 != (double *)0x0;
            }
            if ((pOVar23 == (ON_3fVector *)0x0) || (mapping->m_projection != ray_projection)) {
              pOVar30 = pOVar30 + iVar28;
              if (pdVar7 == (double *)0x0) {
                ON_3dPoint::operator=((ON_3dPoint *)local_168,pOVar30);
              }
              else {
                dVar49 = (double)pOVar30->x;
                dVar4 = (double)pOVar30->y;
                dVar46 = (double)pOVar30->z;
                dVar45 = pdVar7[0xe] * dVar46 + pdVar7[0xc] * dVar49 + pdVar7[0xd] * dVar4 +
                         pdVar7[0xf];
                uVar35 = -(ulong)(dVar45 != 0.0);
                local_158 = (double)(~uVar35 & 0x3ff0000000000000 | (ulong)(1.0 / dVar45) & uVar35);
                dVar45 = local_158 *
                         (pdVar7[7] + dVar46 * pdVar7[6] + dVar49 * pdVar7[4] + dVar4 * pdVar7[5]);
                local_168._8_4_ = SUB84(dVar45,0);
                local_168._0_8_ =
                     local_158 *
                     (pdVar7[3] + dVar46 * pdVar7[2] + dVar49 * *pdVar7 + dVar4 * pdVar7[1]);
                local_168._12_4_ = (int)((ulong)dVar45 >> 0x20);
                local_158 = (dVar46 * pdVar7[10] + dVar49 * pdVar7[8] + dVar4 * pdVar7[9] +
                            pdVar7[0xb]) * local_158;
              }
            }
            else {
              pOVar30 = pOVar30 + iVar28;
              if (bVar34 && pdVar7 != (double *)0x0) {
                dVar49 = (double)pOVar30->x;
                dVar46 = (double)pOVar30->y;
                dVar4 = (double)pOVar30->z;
                dVar45 = pdVar7[0xe] * dVar4 + pdVar7[0xc] * dVar49 + pdVar7[0xd] * dVar46 +
                         pdVar7[0xf];
                uVar35 = -(ulong)(dVar45 != 0.0);
                local_158 = (double)(~uVar35 & 0x3ff0000000000000 | (ulong)(1.0 / dVar45) & uVar35);
                local_168._8_8_ =
                     local_158 *
                     (pdVar7[7] + dVar4 * pdVar7[6] + dVar49 * pdVar7[4] + dVar46 * pdVar7[5]);
                local_168._0_8_ =
                     local_158 *
                     (pdVar7[3] + dVar4 * pdVar7[2] + dVar49 * *pdVar7 + dVar46 * pdVar7[1]);
                local_158 = (dVar4 * pdVar7[10] + dVar49 * pdVar7[8] + dVar46 * pdVar7[9] +
                            pdVar7[0xb]) * local_158;
                dVar49 = (double)pOVar23[iVar28].x;
                dVar4 = (double)pOVar23[iVar28].y;
                dVar46 = (double)pOVar23[iVar28].z;
                local_148._0_8_ = dVar46 * pdVar7[2] + dVar49 * *pdVar7 + dVar4 * pdVar7[1];
                local_148._8_8_ = dVar46 * pdVar7[6] + dVar49 * pdVar7[4] + dVar4 * pdVar7[5];
                local_138 = pdVar7[8] * dVar49 + pdVar7[9] * dVar4 + pdVar7[10] * dVar46;
                ON_3dVector::Unitize((ON_3dVector *)local_148);
              }
              else {
                ON_3dPoint::operator=((ON_3dPoint *)local_168,pOVar30);
                ON_3dVector::operator=((ON_3dVector *)local_148,pOVar23 + iVar28);
              }
            }
            ON_Xform::operator*(&local_2d8,local_118,(ON_3dPoint *)local_168);
            ON_Xform::operator*(&n,local_120,(ON_3dVector *)local_148);
            ON_3dVector::Unitize(&n);
            uVar35 = uVar33;
            if (mapping->m_projection != ray_projection) goto LAB_004f7ea6;
            iVar28 = 0;
            bVar34 = true;
            switch(iVar17) {
            case 1:
              dVar49 = -1.0;
              break;
            case 2:
              dVar49 = 1.0;
              break;
            case 3:
              dVar49 = -1.0;
              goto LAB_004f7cba;
            case 4:
              dVar49 = 1.0;
LAB_004f7cba:
              iVar28 = 1;
LAB_004f7cd5:
              bVar34 = false;
              break;
            case 5:
              dVar49 = -1.0;
              goto LAB_004f7cd3;
            case 6:
              dVar49 = 1.0;
LAB_004f7cd3:
              iVar28 = 2;
              goto LAB_004f7cd5;
            default:
              goto switchD_004f7c89_default;
            }
            dVar46 = dVar49 - *(double *)((long)&local_2d8.x + (ulong)(uint)(iVar28 * 8));
            dVar4 = *(double *)((long)&n.x + (ulong)(uint)(iVar28 * 8));
            if ((double)((ulong)dVar4 & (ulong)DAT_00690010) * 1e+100 <=
                (double)((ulong)dVar46 & (ulong)DAT_00690010)) {
switchD_004f7c89_default:
              uVar15 = 0x40140000;
              uVar39 = 0x9e331dd2;
              uVar41 = 0xffe5f8bd;
              switch(iVar17) {
              case 0:
                goto switchD_004f7e55_caseD_0;
              case 1:
                goto switchD_004f7e55_caseD_1;
              case 2:
                goto switchD_004f7e55_caseD_2;
              case 3:
                goto switchD_004f7e55_caseD_3;
              case 4:
                goto switchD_004f7e55_caseD_4;
              case 5:
                goto switchD_004f7e55_caseD_5;
              case 6:
                goto switchD_004f7e55_caseD_6;
              default:
                goto switchD_004f7e55_default;
              }
            }
            local_2b8 = dVar46 / dVar4;
            uStack_2b0 = 0;
            operator*(&local_e0,local_2b8,&n);
            ON_3dPoint::operator+((ON_3dPoint *)&ws,&local_2d8,&local_e0);
            if (!bVar34) {
              local_130 = ws.m_pFileBlk;
              pdVar7 = ON_3dPoint::operator[]((ON_3dPoint *)&ws,iVar28);
              ws.m_pFileBlk = (ON_Workspace_FBLK *)*pdVar7;
              pdVar7 = ON_3dPoint::operator[]((ON_3dPoint *)&ws,iVar28);
              *pdVar7 = (double)local_130;
            }
            if (((1.490116119385e-08 < ABS((double)ws.m_pFileBlk - dVar49)) ||
                (100000000.0 < ABS((double)CONCAT44(ws.m_pMemBlk._4_4_,ws.m_pMemBlk._0_4_)))) ||
               (uVar39 = (float)local_2b8, uVar41 = local_2b8._4_4_, 100000000.0 < ABS(local_248)))
            goto switchD_004f7c89_default;
switchD_004f7e55_caseD_0:
            operator*(&local_e0,(double)CONCAT44(uVar41,uVar39),&n);
            ON_3dPoint::operator+((ON_3dPoint *)&ws,&local_2d8,&local_e0);
            local_2d8.z = local_248;
            local_2d8.y._0_4_ = ws.m_pMemBlk._0_4_;
            local_2d8.x = (double)ws.m_pFileBlk;
            local_2d8.y._4_4_ = ws.m_pMemBlk._4_4_;
LAB_004f7ea6:
            uVar15 = 0x40140000;
            switch(iVar17) {
            case 1:
switchD_004f7e55_caseD_1:
              local_2d8.x = -local_2d8.y;
              local_2d8.y = local_2d8.z;
              uVar15 = 0x40080000;
              break;
            case 2:
switchD_004f7e55_caseD_2:
              local_2d8.x = local_2d8.y;
              local_2d8.y = local_2d8.z;
              uVar15 = 0x3ff00000;
              break;
            case 3:
switchD_004f7e55_caseD_3:
              local_2d8.y = local_2d8.z;
              uVar15 = 0;
              break;
            case 4:
switchD_004f7e55_caseD_4:
              local_2d8.y = local_2d8.z;
              local_2d8.x = -local_2d8.x;
              uVar15 = 0x40000000;
              break;
            case 5:
switchD_004f7e55_caseD_5:
              local_2d8.x = -local_2d8.x;
              uVar15 = 0x40100000;
              break;
            case 6:
              break;
            default:
              goto switchD_004f7e55_default;
            }
switchD_004f7e55_caseD_6:
            dVar49 = local_2d8.x * (double)DAT_0069b9d0 + (double)DAT_0069b9d0;
            dVar4 = local_2d8.y * DAT_0069b9d0._8_8_ + DAT_0069b9d0._8_8_;
            local_2d8.y._0_4_ = SUB84(dVar4,0);
            local_2d8.x = dVar49;
            local_2d8.y._4_4_ = (int)((ulong)dVar4 >> 0x20);
            local_2d8.z = 0.0;
            if (mapping->m_texture_space == divided) {
              uVar12 = 0x40180000;
              if (mapping->m_bCapped == false) {
                uVar12 = 0x40100000;
              }
              local_2d8.x = ((double)((ulong)uVar15 << 0x20) + dVar49) /
                            (double)((ulong)uVar12 << 0x20);
            }
            ON_Xform::operator*(&local_c8,local_128,&local_2d8);
            bVar34 = ON_3dPoint::IsValid(&local_c8);
            if (!bVar34) break;
            fVar37 = (float)local_c8.x;
            fVar38 = (float)local_c8.y;
            fVar36 = *(float *)((long)&ftc_list.m_a + uVar33 * 8 + 4);
            if ((fVar36 != fVar37) || (NAN(fVar36) || NAN(fVar37))) {
LAB_004f8018:
              *(ulong *)((long)&ftc_list.m_a + uVar33 * 8 + 4) = CONCAT44(fVar38,fVar37);
              *(undefined1 *)((long)&ftc_list.m_a + uVar33) = 1;
              ftc_list._vptr_ON_SimpleArray =
                   (_func_int **)
                   CONCAT44(ftc_list._vptr_ON_SimpleArray._4_4_ + 1,
                            (int)ftc_list._vptr_ON_SimpleArray);
            }
            else if (((float)(&ftc_list.m_count)[uVar33 * 2] != fVar38) ||
                    (NAN((float)(&ftc_list.m_count)[uVar33 * 2]) || NAN(fVar38))) goto LAB_004f8018;
LAB_004f8027:
          }
switchD_004f7e55_default:
          iVar17 = ftc_list._vptr_ON_SimpleArray._4_4_;
          if (0 < ftc_list._vptr_ON_SimpleArray._4_4_ && uVar26 <= (uint)uVar35) {
            ftc_list._vptr_ON_SimpleArray =
                 (_func_int **)CONCAT44(ftc_list._vptr_ON_SimpleArray._4_4_,(int)uVar22);
            ON_SimpleArray<ON__CNewMeshFace>::Append(&mflist,(ON__CNewMeshFace *)&ftc_list);
            local_29c = local_29c + iVar17;
          }
        }
        local_170 = local_170 + 1;
      }
      if (0 < local_29c) {
        ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
                  (&helper,mesh,local_29c + iVar11,&local_230);
        uVar33 = 0;
        uVar22 = (ulong)(uint)mflist.m_count;
        if (mflist.m_count < 1) {
          uVar22 = uVar33;
        }
        for (; uVar33 != uVar22; uVar33 = uVar33 + 1) {
          ftc_list._vptr_ON_SimpleArray = *(_func_int ***)(mflist.m_a + uVar33);
          pfVar31 = &mflist.m_a[uVar33].tc[0].y;
          ftc_list.m_a = *(ON__CMeshFaceTC **)mflist.m_a[uVar33].bNewV;
          OStack_27c.y = mflist.m_a[uVar33].tc[2].y;
          aOStack_274[0] = (mflist.m_a[uVar33].tc + 2)[1];
          ftc_list._16_8_ = *(undefined8 *)pfVar31;
          OStack_27c.x = (float)((ulong)*(undefined8 *)(pfVar31 + 2) >> 0x20);
          lVar6 = (long)(int)ftc_list._vptr_ON_SimpleArray;
          pOVar25 = (mesh->m_F).m_a;
          iVar17 = pOVar25[lVar6].vi[2];
          iVar11 = pOVar25[lVar6].vi[3];
          for (lVar14 = 0; (ulong)(iVar17 != iVar11) + 3 != lVar14; lVar14 = lVar14 + 1) {
            if (*(char *)((long)&ftc_list.m_a + lVar14) == '\x01') {
              ON__CChangeTextureCoordinateHelper::ChangeTextureCoordinate
                        (&helper,pOVar25[lVar6].vi,(int)lVar14,
                         *(float *)((long)&ftc_list.m_a + lVar14 * 8 + 4),
                         (float)(&ftc_list.m_count)[lVar14 * 2],local_230,mesh_T_stride);
            }
          }
        }
        ON__CChangeTextureCoordinateHelper::~ON__CChangeTextureCoordinateHelper(&helper);
      }
      ON_SimpleArray<ON__CNewMeshFace>::~ON_SimpleArray(&mflist);
    }
  }
  return;
}

Assistant:

static
void AdjustMeshPeriodicTextureCoordinatesHelper(
          ON_Mesh& mesh,
          const ON_Xform* mesh_xform,
          float* mesh_T,
          int    mesh_T_stride,
          const int* Tsd,
          double two_pi_tc,
          const ON_TextureMapping& mapping
          )
{
  // This helper adjusts texture coordinates on faces that
  // span the seam on mapping spheres and cylinders and
  // resolves the multiple valued problem that
  // exists at the poles of sphere mappings.

  const int vcnt = mesh.m_V.Count();
  const int fcnt = mesh.m_F.Count();
  if ( vcnt < 3 || fcnt < 1 || vcnt != mesh.m_T.Count() )
    return;

  // see if any texture coordinate adjustment is necessary
  const ON_TextureMapping::TYPE mapping_type = mapping.m_type;
  const bool bSphereCheck = ( ON_TextureMapping::TYPE::sphere_mapping == mapping_type );
  const bool bCylinderCheck = (Tsd && ON_TextureMapping::TYPE::cylinder_mapping == mapping_type);
  const bool bBoxCheck = (Tsd && ON_TextureMapping::TYPE::box_mapping == mapping_type);

  if ( bBoxCheck && ON_TextureMapping::TEXTURE_SPACE::single == mapping.m_texture_space )
  {
    AdjustSingleBoxTextureCoordinatesHelper( mesh, mesh_xform, mesh_T, mesh_T_stride, Tsd, mapping );
    return;
  }

  ON_Workspace ws;
  int* quad = ws.GetIntMemory(vcnt); // ~ws will free quad memory
  float* Tx = (float*)ws.GetMemory(vcnt*sizeof(Tx[0]));
  float t;
  int vi, ti, q=0;
  int ftc_count = 0;

  const float ang0 = (float)(0.25*two_pi_tc);
  const float ang1 = (float)(0.75*two_pi_tc);


  for ( vi = ti = 0; vi < vcnt; vi++, ti += mesh_T_stride )
  {
    quad[vi] = 0;
    Tx[vi] = mesh_T[ti];
    if ( bCylinderCheck )
    {
      if ( 1 != Tsd[vi] )
        continue;
    }
    else if ( bBoxCheck )
    {
      if ( 1 != Tsd[vi] && 3 != Tsd[vi] )
        continue;
    }
    else if ( bSphereCheck )
    {
      t = mesh_T[ti+1]; // t = "v" texture coordinate
      if ( t < 0.001f )
      {
        quad[vi] = 8; q |= 8; // south pole point
        ftc_count++;
        continue;
      }
      if ( t > 0.999f )
      {
        quad[vi] = 8; q |= 8; // north pole point
        ftc_count++;
        continue;
      }
    }

    t = Tx[vi]; // t = "u" texture coordinate
    if ( t < ang0 )
    {
      quad[vi] = 1; q |= 1; // longitude < pi/2
      ftc_count++;
    }
    else if ( t > ang1 )
    {
      quad[vi] = 4; q |= 4; // longitude > 3pi/2
      ftc_count++;
    }
  }

  if ( 0 == q || 1 == q || 4 == q )
  {
    // nothing needs to be adjusted
    return;
  }

  // 4*ftc_count = (over) estimate of the number of faces that
  // will be changed.
  ON_SimpleArray<ON__CMeshFaceTC> ftc_list(ftc_count*4 + 128);
  ftc_count = 0;
  const ON_MeshFace* F = mesh.m_F.Array();
  const int* Fvi;
  int fi;
  ON__CMeshFaceTC ftc;
  memset(&ftc,0,sizeof(ftc));
  float t0, t1;

  for ( fi = 0; fi < fcnt; fi++ )
  {
    Fvi = F[fi].vi;

    ftc.quad[0] = quad[Fvi[0]];
    ftc.quad[1] = quad[Fvi[1]];
    ftc.quad[2] = quad[Fvi[2]];
    ftc.quad[3] = quad[Fvi[3]];

    q = (ftc.quad[0] | ftc.quad[1] | ftc.quad[2] | ftc.quad[3]);
    if ( 0 == q || 1 == q || 4 == q )
    {
      // no adjustments need to be made
      continue;
    }

    // ftc.fi will be set to fi if a texture coordinate needs to be adjusted
    ftc.fi = -1;

    ftc.Tx[0] = Tx[Fvi[0]];
    ftc.Tx[1] = Tx[Fvi[1]];
    ftc.Tx[2] = Tx[Fvi[2]];
    ftc.Tx[3] = Tx[Fvi[3]];

    if ( 0 != (8&q) )
    {
      // see if check for north/south sphere mapping poles and fix them
      if ( 8 == ftc.quad[0] )
      {
        t0 = (8 == ftc.quad[3]) ? ON_UNSET_FLOAT : ftc.Tx[3];
        t1 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[0] = PoleFix(t0,t1);
          ftc.quad[0] = ((ftc.Tx[0] < ang0) ? 1 : ((ftc.Tx[0] > ang1) ? 4 : 0));
          q |= ftc.quad[0];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[1] )
      {
        t0 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        t1 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[1] = PoleFix(t0,t1);
          ftc.quad[1] = ((ftc.Tx[1] < ang0) ? 1 : ((ftc.Tx[1] > ang1) ? 4 : 0));
          q |= ftc.quad[1];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[2] )
      {
        int k = (Fvi[2] == Fvi[3]) ? 0 : 3;
        t0 = (8 == ftc.quad[1]) ? ON_UNSET_FLOAT : ftc.Tx[1];
        t1 = (8 == ftc.quad[k]) ? ON_UNSET_FLOAT : ftc.Tx[k];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[2] = PoleFix(t0,t1);
          ftc.quad[2] = ((ftc.Tx[2] < ang0) ? 1 : ((ftc.Tx[2] > ang1) ? 4 : 0));
          if ( !k )
          {
            ftc.Tx[3] = ftc.Tx[2];
            ftc.quad[3] = ftc.quad[2];
          }
          q |= ftc.quad[2];
          ftc.fi = fi;
        }
      }
      if ( 8 == ftc.quad[3] && Fvi[2] != Fvi[3] )
      {
        t0 = (8 == ftc.quad[2]) ? ON_UNSET_FLOAT : ftc.Tx[2];
        t1 = (8 == ftc.quad[0]) ? ON_UNSET_FLOAT : ftc.Tx[0];
        if ( ON_UNSET_FLOAT != t0 || ON_UNSET_FLOAT != t1 )
        {
          ftc.Tx[3] = PoleFix(t0,t1);
          ftc.quad[3] = ((ftc.Tx[3] < ang0) ? 1 : ((ftc.Tx[3] > ang1) ? 4 : 0));
          q |= ftc.quad[3];
          ftc.fi = fi;
        }
      }
    }

    if ( 5 == (5&q) )
    {
      // The face has corners on both sides of the seam
      if ( two_pi_tc == 1.0 )
      {
        if ( 1 == ftc.quad[0] ) {ftc.Tx[0] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[1] ) {ftc.Tx[1] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[2] ) {ftc.Tx[2] += 1.0f; ftc.fi = fi;}
        if ( 1 == ftc.quad[3] ) {ftc.Tx[3] += 1.0f; ftc.fi = fi;}
      }
      else
      {
        // With divided textures, wrapping the texture coordinate
        // does not work because it wraps into a region of the
        // texture not use by this "side".  In this case, the
        // only thing to do is to pick the best end of the texture
        // map and clamp the tcs that hang over.  If the mesh
        // has edges near the texture seam, the picture will
        // still look ok.
        float f0=0.0f, f1=0.0f, twopitc = (float)two_pi_tc;
        //int f0cnt=0, f1cnt=0;
        if ( 1 == ftc.quad[0] ) f0 += ftc.Tx[0]; else if ( 4 == ftc.quad[0] ) f1 += twopitc-ftc.Tx[0];
        if ( 1 == ftc.quad[1] ) f0 += ftc.Tx[1]; else if ( 4 == ftc.quad[1] ) f1 += twopitc-ftc.Tx[1];
        if ( 1 == ftc.quad[2] ) f0 += ftc.Tx[2]; else if ( 4 == ftc.quad[2] ) f1 += twopitc-ftc.Tx[2];
        if (Fvi[2] != Fvi[3])
        {
          if ( 1 == ftc.quad[3] ) f0 += ftc.Tx[3]; else if ( 4 == ftc.quad[3] ) f1 += twopitc-ftc.Tx[3];
        }
        if (f0 >= f1 )
        {
          // "most" of the face is on the left side of the texture
          // If a vertex is on the right side, clamp its tc to 0.
          if ( 4 == ftc.quad[0] ) {ftc.Tx[0] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[1] ) {ftc.Tx[1] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[2] ) {ftc.Tx[2] = 0.0f; ftc.fi = fi;}
          if ( 4 == ftc.quad[3] ) {ftc.Tx[3] = 0.0f; ftc.fi = fi;}
        }
        else
        {
          // "most" of the face is on the right side of the texture
          // If a vertex is on the left side, clamp its tc to two_pi_tc.
          if ( 1 == ftc.quad[0] ) {ftc.Tx[0] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[1] ) {ftc.Tx[1] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[2] ) {ftc.Tx[2] = twopitc; ftc.fi = fi;}
          if ( 1 == ftc.quad[3] ) {ftc.Tx[3] = twopitc; ftc.fi = fi;}
        }
      }
    }

    if ( ftc.fi >= 0 )
    {
      // face will require special handling
      ftc_list.Append(ftc);
    }
  }

  ftc_count = ftc_list.Count();
  if ( ftc_count <= 0 )
    return;

  // Count the number of new vertices that will be added.
  int ftci;
  int newvcnt = 0;
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    Fvi = F[ftc_local.fi].vi;
    if ( ftc_local.Tx[0] != Tx[Fvi[0]] )
    {
      ftc_local.bSetT[0] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[1] != Tx[Fvi[1]] )
    {
      ftc_local.bSetT[1] = true;
      newvcnt++;
    }
    if ( ftc_local.Tx[2] != Tx[Fvi[2]] )
    {
      ftc_local.bSetT[2] = true;
      newvcnt++;
    }
    if ( Fvi[2] != Fvi[3] )
    {
      if ( ftc_local.Tx[3] != Tx[Fvi[3]] )
      {
        ftc_local.bSetT[3] = true;
        newvcnt++;
      }
    }
  }

  if ( newvcnt <= 0 )
    return;


  F = 0; // Setting them to nullptr makes sure anybody who
         // tries to use them below will crash.

  // reserve room for new vertex information
  ON__CChangeTextureCoordinateHelper helper(mesh,newvcnt,mesh_T);

  // add vertices and update mesh faces
  for ( ftci = 0; ftci < ftc_count; ftci++ )
  {
    const ON__CMeshFaceTC& ftc_local = ftc_list[ftci];
    int* meshFvi = mesh.m_F[ftc_local.fi].vi;

    if ( ftc_local.bSetT[0] )
    {
      helper.ChangeTextureCoordinate(meshFvi,0,ftc_local.Tx[0],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[1] )
    {
      helper.ChangeTextureCoordinate(meshFvi,1,ftc_local.Tx[1],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[2] )
    {
      helper.ChangeTextureCoordinate(meshFvi,2,ftc_local.Tx[2],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
    if ( ftc_local.bSetT[3] )
    {
      helper.ChangeTextureCoordinate(meshFvi,3,ftc_local.Tx[3],ON_UNSET_FLOAT,mesh_T,mesh_T_stride);
    }
  }
}